

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-parsing-utils.c
# Opt level: O0

void greatest_set_verbosity(uint verbosity)

{
  uint verbosity_local;
  
  greatest_info.verbosity = (uchar)verbosity;
  return;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(parsing_int32);
    RUN_TEST(parsing_float);
    RUN_TEST(parsing_double);
    RUN_TEST(parsing_usize);
    RUN_TEST(parsing_bool);

    GREATEST_MAIN_END(); /* display results */
}